

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_gYearMonth(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  Status SVar3;
  XMLCh *pXVar4;
  char *pcVar5;
  XSValue *pXVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  undefined1 *__src;
  void *pvVar10;
  bool bVar11;
  StrX local_5d8;
  StrX local_5c8;
  StrX local_5b8;
  long local_5a8;
  XMLCh *actRetCanRep_5;
  undefined1 local_598 [4];
  Status myStatus_17;
  StrX local_588;
  StrX local_578;
  long local_568;
  XMLCh *actRetCanRep_4;
  undefined1 local_558 [4];
  Status myStatus_16;
  StrX local_548;
  StrX local_538;
  long local_528;
  XMLCh *actRetCanRep_3;
  undefined1 local_518 [4];
  Status myStatus_15;
  StrX local_508;
  StrX local_4f8;
  long local_4e8;
  XMLCh *actRetCanRep_2;
  undefined1 local_4d8 [4];
  Status myStatus_14;
  StrX local_4c8;
  StrX local_4b8;
  long local_4a8;
  XMLCh *actRetCanRep_1;
  undefined1 local_498 [4];
  Status myStatus_13;
  StrX local_488;
  StrX local_478;
  long local_468;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_448;
  StrX local_438;
  XSValue *local_428;
  XSValue *actRetValue_5;
  undefined1 local_418 [4];
  Status myStatus_11;
  StrX local_408;
  StrX local_3f8;
  XSValue *local_3e8;
  XSValue *actRetValue_4;
  undefined1 local_3d8 [4];
  Status myStatus_10;
  StrX local_3c8;
  StrX local_3b8;
  XSValue *local_3a8;
  XSValue *actRetValue_3;
  undefined1 local_398 [4];
  Status myStatus_9;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  StrX local_338;
  XSValue *local_328;
  XSValue *actRetValue_2;
  undefined1 local_318 [4];
  Status myStatus_8;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  StrX local_2b8;
  XSValue *local_2a8;
  XSValue *actRetValue_1;
  undefined1 local_298 [4];
  Status myStatus_7;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  StrX local_238;
  XSValue *local_228;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_208;
  StrX local_1f8;
  byte local_1e5;
  Status local_1e4;
  undefined1 local_1e0 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_1d0;
  StrX local_1c0;
  byte local_1ad;
  Status local_1ac;
  undefined1 local_1a8 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_198;
  StrX local_188;
  byte local_175;
  Status local_174;
  undefined1 local_170 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_160;
  byte local_14d;
  Status local_14c;
  undefined1 local_148 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_138;
  byte local_125;
  Status local_124;
  undefined1 local_120 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_100;
  byte local_ed;
  Status local_ec;
  undefined1 local_e8 [3];
  bool actRetValid;
  Status myStatus;
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char iv_3 [11];
  char iv_2 [9];
  char iv_1 [8];
  char v_3 [14];
  char v_2 [14];
  char cStack_22;
  char cStack_21;
  char v_1 [16];
  bool toValidate;
  DataType dt;
  
  builtin_strncpy(v_2 + 8,"   200",6);
  cStack_22 = '0';
  cStack_21 = '0';
  builtin_strncpy(v_2,"14:00",6);
  builtin_strncpy(v_3 + 8,"0200-1",6);
  builtin_strncpy(v_3,"14:00",6);
  builtin_strncpy(iv_1,"2000-02-",8);
  stack0xffffffffffffffb0 = 0x32312d30303030;
  stack0xffffffffffffffa0 = 0x31312d303030322b;
  iv_2[0] = '\0';
  act_v_ran_v_1.fValue._24_7_ = 0x30392e30303032;
  stack0xffffffffffffff97 = 0x32302d;
  act_v_ran_v_1.f_datatype = 20000;
  act_v_ran_v_1._4_4_ = 2;
  act_v_ran_v_1.fValue.f_int = 0;
  act_v_ran_v_1.fValue.f_datetime.f_month = 0;
  act_v_ran_v_1.fValue.f_datetime.f_day = 0;
  act_v_ran_v_1.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_1.fValue._16_8_ = 0;
  act_v_ran_v_2.f_datatype = 200;
  act_v_ran_v_2._4_4_ = 0xb;
  act_v_ran_v_2.fValue.f_int = 0;
  act_v_ran_v_2.fValue.f_datetime.f_month = 0;
  act_v_ran_v_2.fValue.f_datetime.f_day = 0;
  act_v_ran_v_2.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_2.fValue._16_8_ = 0;
  act_v_ran_v_3.f_datatype = 2000;
  act_v_ran_v_3._4_4_ = 2;
  act_v_ran_v_3.fValue.f_int = 0;
  act_v_ran_v_3.fValue.f_datetime.f_month = 0;
  act_v_ran_v_3.fValue.f_datetime.f_day = 0;
  act_v_ran_v_3.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_3.fValue._16_8_ = 0;
  local_ec = st_Init;
  StrX::StrX(&local_100,v_2 + 8);
  pXVar4 = StrX::unicodeForm(&local_100);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gYearMonth,&local_ec,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_100);
  local_ed = bVar1 & 1;
  if (local_ed != 1) {
    pXVar4 = getDataTypeString(dt_gYearMonth);
    StrX::StrX((StrX *)local_120,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_120);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf60,v_2 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_120);
    errSeen = true;
  }
  local_124 = st_Init;
  StrX::StrX(&local_138,v_3 + 8);
  pXVar4 = StrX::unicodeForm(&local_138);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gYearMonth,&local_124,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  local_125 = bVar1 & 1;
  if (local_125 != 1) {
    pXVar4 = getDataTypeString(dt_gYearMonth);
    StrX::StrX((StrX *)local_148,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_148);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf61,v_3 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_148);
    errSeen = true;
  }
  local_14c = st_Init;
  StrX::StrX(&local_160,iv_1);
  pXVar4 = StrX::unicodeForm(&local_160);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gYearMonth,&local_14c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_160);
  local_14d = bVar1 & 1;
  if (local_14d != 1) {
    pXVar4 = getDataTypeString(dt_gYearMonth);
    StrX::StrX((StrX *)local_170,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_170);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf62,iv_1,pcVar5,1);
    StrX::~StrX((StrX *)local_170);
    errSeen = true;
  }
  local_174 = st_Init;
  StrX::StrX(&local_188,iv_2 + 8);
  pXVar4 = StrX::unicodeForm(&local_188);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gYearMonth,&local_174,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_188);
  local_175 = bVar1 & 1;
  if (local_175 == 0) {
    if (local_174 != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX((StrX *)local_1a8,pXVar4);
      pcVar5 = StrX::localForm((StrX *)local_1a8);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_174);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xf65,iv_2 + 8,pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)local_1a8);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_gYearMonth);
    StrX::StrX(&local_198,pXVar4);
    pcVar5 = StrX::localForm(&local_198);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf65,iv_2 + 8,pcVar5,0);
    StrX::~StrX(&local_198);
    errSeen = true;
  }
  local_1ac = st_Init;
  StrX::StrX(&local_1c0,iv_3 + 8);
  pXVar4 = StrX::unicodeForm(&local_1c0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gYearMonth,&local_1ac,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1c0);
  local_1ad = bVar1 & 1;
  if (local_1ad == 0) {
    if (local_1ac != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX((StrX *)local_1e0,pXVar4);
      pcVar5 = StrX::localForm((StrX *)local_1e0);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_1ac);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xf66,iv_3 + 8,pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)local_1e0);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_gYearMonth);
    StrX::StrX(&local_1d0,pXVar4);
    pcVar5 = StrX::localForm(&local_1d0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf66,iv_3 + 8,pcVar5,0);
    StrX::~StrX(&local_1d0);
    errSeen = true;
  }
  local_1e4 = st_Init;
  StrX::StrX(&local_1f8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar4 = StrX::unicodeForm(&local_1f8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_gYearMonth,&local_1e4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1f8);
  local_1e5 = bVar1 & 1;
  if (local_1e5 == 0) {
    if (local_1e4 != st_FOCA0002) {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX((StrX *)&myStatus_6,pXVar4);
      pcVar5 = StrX::localForm((StrX *)&myStatus_6);
      pcVar7 = getStatusString(st_FOCA0002);
      pcVar8 = getStatusString(local_1e4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xf67,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
      StrX::~StrX((StrX *)&myStatus_6);
      errSeen = true;
    }
  }
  else {
    pXVar4 = getDataTypeString(dt_gYearMonth);
    StrX::StrX(&local_208,pXVar4);
    pcVar5 = StrX::localForm(&local_208);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf67,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,0);
    StrX::~StrX(&local_208);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_238,v_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_238);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gYearMonth,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_238);
    local_228 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX((StrX *)local_298,pXVar4);
      StrX::localForm((StrX *)local_298);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf81,v_2 + 8);
      StrX::~StrX((StrX *)local_298);
      errSeen = true;
    }
    else {
      memcpy(&local_260,pXVar6,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_288,pvVar10,0x28);
      actValue.fValue.f_long = uStack_258;
      actValue._0_8_ = local_260;
      actValue.fValue._8_8_ = local_250;
      actValue.fValue._16_8_ = uStack_248;
      actValue.fValue.f_datetime.f_milisec = (double)local_240;
      expValue.fValue.f_long = uStack_280;
      expValue._0_8_ = local_288;
      expValue.fValue._8_8_ = local_278;
      expValue.fValue._16_8_ = uStack_270;
      expValue.fValue.f_datetime.f_milisec = (double)local_268;
      bVar2 = compareActualValue(dt_gYearMonth,actValue,expValue);
      pXVar6 = local_228;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_228 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_228);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_2b8,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_2b8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gYearMonth,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2b8);
    local_2a8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX((StrX *)local_318,pXVar4);
      StrX::localForm((StrX *)local_318);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf82,v_3 + 8);
      StrX::~StrX((StrX *)local_318);
      errSeen = true;
    }
    else {
      memcpy(&local_2e0,pXVar6,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_3.fValue + 0x18);
      memcpy(&local_308,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_2d8;
      actValue_00._0_8_ = local_2e0;
      actValue_00.fValue._8_8_ = local_2d0;
      actValue_00.fValue._16_8_ = uStack_2c8;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_2c0;
      expValue_00.fValue.f_long = uStack_300;
      expValue_00._0_8_ = local_308;
      expValue_00.fValue._8_8_ = local_2f8;
      expValue_00.fValue._16_8_ = uStack_2f0;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_2e8;
      bVar2 = compareActualValue(dt_gYearMonth,actValue_00,expValue_00);
      pXVar6 = local_2a8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_2a8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2a8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_338,iv_1);
    pXVar4 = StrX::unicodeForm(&local_338);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gYearMonth,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_338);
    local_328 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX((StrX *)local_398,pXVar4);
      StrX::localForm((StrX *)local_398);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf83,iv_1);
      StrX::~StrX((StrX *)local_398);
      errSeen = true;
    }
    else {
      memcpy(&local_360,pXVar6,0x28);
      __src = local_e8;
      memcpy(&local_388,__src,0x28);
      actValue_01.fValue.f_long = uStack_358;
      actValue_01._0_8_ = local_360;
      actValue_01.fValue._8_8_ = local_350;
      actValue_01.fValue._16_8_ = uStack_348;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_340;
      expValue_01.fValue.f_long = uStack_380;
      expValue_01._0_8_ = local_388;
      expValue_01.fValue._8_8_ = local_378;
      expValue_01.fValue._16_8_ = uStack_370;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_368;
      bVar2 = compareActualValue(dt_gYearMonth,actValue_01,expValue_01);
      pXVar6 = local_328;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_328 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_328);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,__src);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_3b8,iv_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_3b8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gYearMonth,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3b8);
    local_3a8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX((StrX *)local_3d8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3d8);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xf86,iv_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3d8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_3c8,pXVar4);
      StrX::localForm(&local_3c8);
      pvVar10 = (void *)0xf86;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf86,iv_2 + 8);
      StrX::~StrX(&local_3c8);
      pXVar6 = local_3a8;
      errSeen = true;
      if (local_3a8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3a8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_3f8,iv_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_3f8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gYearMonth,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3f8);
    local_3e8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX((StrX *)local_418,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_418);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xf87,iv_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_418);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_408,pXVar4);
      StrX::localForm(&local_408);
      pvVar10 = (void *)0xf87;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf87,iv_3 + 8);
      StrX::~StrX(&local_408);
      pXVar6 = local_3e8;
      errSeen = true;
      if (local_3e8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3e8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_438,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_438);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_gYearMonth,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_438);
    local_428 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX((StrX *)&myStatus_12,pXVar4);
        pcVar5 = StrX::localForm((StrX *)&myStatus_12);
        pcVar7 = getStatusString(st_FOCA0002);
        pcVar8 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xf88,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)&myStatus_12);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_448,pXVar4);
      StrX::localForm(&local_448);
      pvVar10 = (void *)0xf88;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf88,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_448);
      pXVar6 = local_428;
      errSeen = true;
      if (local_428 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_428);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_478,v_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_478);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gYearMonth,(Status *)&actRetCanRep,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    local_468 = lVar9;
    if (lVar9 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX((StrX *)local_498,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_498);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfa4,v_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_498);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_488,pXVar4);
      StrX::localForm(&local_488);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfa4,v_2 + 8);
      StrX::~StrX(&local_488);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_468);
      errSeen = true;
    }
    actRetCanRep_1._4_4_ = st_Init;
    StrX::StrX(&local_4b8,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_4b8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gYearMonth,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4b8);
    local_4a8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_1._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX((StrX *)local_4d8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_4d8);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_1._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfa5,v_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_4d8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_4c8,pXVar4);
      StrX::localForm(&local_4c8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfa5,v_3 + 8);
      StrX::~StrX(&local_4c8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4a8);
      errSeen = true;
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_4f8,iv_1);
    pXVar4 = StrX::unicodeForm(&local_4f8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gYearMonth,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4f8);
    local_4e8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX((StrX *)local_518,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_518);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfa6,iv_1,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_518);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_508,pXVar4);
      StrX::localForm(&local_508);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfa6,iv_1);
      StrX::~StrX(&local_508);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4e8);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_538,iv_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_538);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gYearMonth,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_538);
    local_528 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_3._4_4_) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX((StrX *)local_558,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_558);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfaa,iv_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_558);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_548,pXVar4);
      StrX::localForm(&local_548);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfaa,iv_2 + 8);
      StrX::~StrX(&local_548);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_528);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_578,iv_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_578);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gYearMonth,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_578);
    local_568 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_4._4_4_) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX((StrX *)local_598,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_598);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfac,iv_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_598);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_588,pXVar4);
      StrX::localForm(&local_588);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfac,iv_3 + 8);
      StrX::~StrX(&local_588);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_568);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_5b8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_5b8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_gYearMonth,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5b8);
    local_5a8 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_5._4_4_) {
        pXVar4 = getDataTypeString(dt_gYearMonth);
        StrX::StrX(&local_5d8,pXVar4);
        pcVar5 = StrX::localForm(&local_5d8);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfae,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX(&local_5d8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_gYearMonth);
      StrX::StrX(&local_5c8,pXVar4);
      StrX::localForm(&local_5c8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfae,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_5c8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5a8);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_gYearMonth()
{
    const XSValue::DataType dt = XSValue::dt_gYearMonth;
    bool  toValidate = true;

    const char v_1[]="   20000-02   \n";
    const char v_2[]="0200-11+14:00";
    const char v_3[]="2000-02-14:00";

    const char iv_1[]="0000-12";
    const char iv_2[]="+2000-11";
    const char iv_3[]="2000.90-02";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    act_v_ran_v_1.fValue.f_datetime.f_year    = 20000;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 02;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 200;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 11;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 02;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}